

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::TimingCheckEventSyntax::setChild
          (TimingCheckEventSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  TimingCheckConditionSyntax *local_148;
  NameSyntax *local_140;
  EdgeControlSpecifierSyntax *local_138;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  NameSyntax *local_38;
  NameSyntax *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  TimingCheckEventSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->edge).kind = (undefined2)local_28;
    (this->edge).field_0x2 = local_28._2_1_;
    (this->edge).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->edge).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->edge).info = local_20;
    break;
  case 1:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_138 = (EdgeControlSpecifierSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_138 = SyntaxNode::as<slang::syntax::EdgeControlSpecifierSyntax>(pSVar1);
    }
    this->controlSpecifier = local_138;
    break;
  case 2:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_140 = (NameSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_140 = SyntaxNode::as<slang::syntax::NameSyntax>(pSVar1);
    }
    local_38 = local_140;
    not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
              ((not_null<slang::syntax::NameSyntax*> *)&local_30,&local_38);
    (this->terminal).ptr = local_30;
    break;
  case 3:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_148 = (TimingCheckConditionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_148 = SyntaxNode::as<slang::syntax::TimingCheckConditionSyntax>(pSVar1);
    }
    this->condition = local_148;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_d9);
    std::operator+(&local_b8,&local_d8,":");
    std::__cxx11::to_string(&local_110,0x31ea);
    std::operator+(&local_98,&local_b8,&local_110);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_58);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void TimingCheckEventSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: edge = child.token(); return;
        case 1: controlSpecifier = child.node() ? &child.node()->as<EdgeControlSpecifierSyntax>() : nullptr; return;
        case 2: terminal = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 3: condition = child.node() ? &child.node()->as<TimingCheckConditionSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}